

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O3

void __thiscall xscript::tokenizer::scanner::print(scanner *this)

{
  ostream *poVar1;
  token local_60;
  undefined1 auStack_48 [8];
  token t;
  
  token::token((token *)auStack_48);
LAB_00113a04:
  do {
    next(&local_60,this);
    t.literal._M_len = (size_t)local_60.literal._M_str;
    auStack_48._1_7_ = local_60._1_7_;
    auStack_48[0] = (undefined1)local_60.type;
    t._0_8_ = local_60.literal._M_len;
    if (1 < auStack_48._0_4_ - TK_EOF) {
      if (auStack_48._0_4_ - TK_SPACE < 2) goto LAB_00113a04;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,auStack_48._0_4_);
      local_60.type._0_1_ = TK_ASSIGN_XOR;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(char *)t.literal._M_len,t._0_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if (auStack_48._0_4_ == TK_EOF) {
      return;
    }
  } while( true );
}

Assistant:

void scanner::print() {
    token t;
    do {
        t = next();
        if (t != TK_SPACE && t != TK_TAB && t != TK_EOL && t != TK_EOF) {
            std::cout << t.type << ' ' << t.literal << std::endl;
        }
    } while (t != TK_EOF);
}